

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BamStandardIndex_p.cpp
# Opt level: O1

void __thiscall
BamTools::Internal::BamStandardIndex::OpenFile
          (BamStandardIndex *this,string *filename,OpenMode mode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  int iVar2;
  IBamIODevice *pIVar3;
  BamException *pBVar4;
  string message;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  CloseFile(this);
  pIVar3 = BamDeviceFactory::CreateDevice(filename);
  (this->m_resources).Device = pIVar3;
  if (pIVar3 == (IBamIODevice *)0x0) {
    paVar1 = &local_60.field_2;
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"could not open file: ","");
    std::operator+(&local_40,&local_60,filename);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p);
    }
    pBVar4 = (BamException *)__cxa_allocate_exception(0x28);
    local_60._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"BamStandardIndex::OpenFile","");
    BamException::BamException(pBVar4,&local_60,&local_40);
    __cxa_throw(pBVar4,&BamException::typeinfo,BamException::~BamException);
  }
  (*pIVar3->_vptr_IBamIODevice[4])(pIVar3,(ulong)mode);
  pIVar3 = (this->m_resources).Device;
  if (pIVar3 != (IBamIODevice *)0x0) {
    iVar2 = (*pIVar3->_vptr_IBamIODevice[10])();
    if ((char)iVar2 != '\0') {
      return;
    }
  }
  paVar1 = &local_60.field_2;
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_60,"could not open file: ","");
  std::operator+(&local_40,&local_60,filename);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p);
  }
  pBVar4 = (BamException *)__cxa_allocate_exception(0x28);
  local_60._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_60,"BamStandardIndex::OpenFile","");
  BamException::BamException(pBVar4,&local_60,&local_40);
  __cxa_throw(pBVar4,&BamException::typeinfo,BamException::~BamException);
}

Assistant:

void BamStandardIndex::OpenFile(const std::string& filename, IBamIODevice::OpenMode mode)
{

    // make sure any previous index file is closed
    CloseFile();

    m_resources.Device = BamDeviceFactory::CreateDevice(filename);
    if (m_resources.Device == 0) {
        const std::string message = std::string("could not open file: ") + filename;
        throw BamException("BamStandardIndex::OpenFile", message);
    }

    // attempt to open file
    m_resources.Device->Open(mode);
    if (!IsDeviceOpen()) {
        const std::string message = std::string("could not open file: ") + filename;
        throw BamException("BamStandardIndex::OpenFile", message);
    }
}